

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infoPageAnalyzer.cpp
# Opt level: O2

string * __thiscall
infoPageAnalyzer::getGidInString_abi_cxx11_(string *__return_storage_ptr__,infoPageAnalyzer *this)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,"?gid=",&local_59);
  std::__cxx11::string::string((string *)&local_58,"?gid=",&local_5a);
  pageAnalyzer::getInfoFromContent
            (__return_storage_ptr__,&this->super_pageAnalyzer,&local_38,0,0x12,&local_58,'&');
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string infoPageAnalyzer::getGidInString() {
    return this->getInfoFromContent(std::string("?gid="), 0, GETMODE_PART, std::string("?gid="), '&');
}